

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hnsw.hpp
# Opt level: O0

void __thiscall hnsw::HNSWIndex::Insert(HNSWIndex *this,index_t q)

{
  bool bVar1;
  layer_t lVar2;
  size_type sVar3;
  iterator this_00;
  iterator q_00;
  Vertex *pVVar4;
  float *pfVar5;
  int *piVar6;
  reference ppVar7;
  reference this_01;
  reference this_02;
  uint in_ESI;
  Point *in_RDI;
  value_type *edges;
  Point *p;
  iterator __end3;
  iterator __begin3;
  PointSet *__range3;
  PointSet selected_points;
  MaxHeap candidates;
  uint32_t maxM;
  layer_t l_1;
  layer_t l;
  Point ep;
  float *query;
  __normal_iterator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_*,_std::vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>_>
  iter;
  Vertex *vertex;
  vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
  *in_stack_fffffffffffffec8;
  Matrix *in_stack_fffffffffffffed0;
  __normal_iterator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_*,_std::vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>_>
  *in_stack_fffffffffffffed8;
  MaxHeap *this_03;
  HNSWIndex *in_stack_fffffffffffffee0;
  Vertex *this_04;
  size_type in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  size_type in_stack_fffffffffffffef8;
  Point PVar8;
  vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
  *in_stack_ffffffffffffff00;
  Point *__x;
  undefined7 in_stack_ffffffffffffff18;
  char cVar9;
  HNSWIndex *in_stack_ffffffffffffff20;
  __normal_iterator<std::pair<unsigned_int,_float>_*,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
  local_b0;
  undefined1 *local_a8;
  undefined1 local_90 [24];
  MaxHeap local_78;
  float local_58;
  int local_54;
  float local_50;
  float local_4c;
  pair<unsigned_int,_float> local_48;
  __normal_iterator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_*,_std::vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>_>
  in_stack_ffffffffffffffc8;
  __normal_iterator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_*,_std::vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>_>
  local_20;
  reference local_18;
  uint local_c;
  
  local_c = in_ESI;
  local_18 = std::vector<hnsw::HNSWIndex::Vertex,_std::allocator<hnsw::HNSWIndex::Vertex>_>::
             operator[]((vector<hnsw::HNSWIndex::Vertex,_std::allocator<hnsw::HNSWIndex::Vertex>_> *
                        )(in_RDI + 6),(ulong)in_ESI);
  cVar9 = '\0';
  if (local_18->layer == 0) {
    sVar3 = std::
            vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
            ::size(&local_18->neighbors);
    cVar9 = '\0';
    if (sVar3 == 0) {
      cVar9 = '\x01';
    }
  }
  if (cVar9 != '\0') {
    lVar2 = RandomChoiceLayer(in_stack_fffffffffffffee0);
    local_18->layer = lVar2;
    std::
    vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
    ::resize((vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
              *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
             in_stack_fffffffffffffee8);
    this_00 = std::
              vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
              ::begin((vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                       *)in_stack_fffffffffffffec8);
    local_20 = __gnu_cxx::
               __normal_iterator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_*,_std::vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>_>
               ::operator+(in_stack_fffffffffffffed8,(difference_type)in_stack_fffffffffffffed0);
    while( true ) {
      q_00 = std::
             vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
             ::end((vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                    *)in_stack_fffffffffffffec8);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_*,_std::vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>_>
                          *)in_stack_fffffffffffffed0,
                         (__normal_iterator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_*,_std::vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>_>
                          *)in_stack_fffffffffffffec8);
      if (!bVar1) break;
      __gnu_cxx::
      __normal_iterator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_*,_std::vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>_>
      ::operator->(&local_20);
      std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
      ::reserve(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      in_stack_ffffffffffffffc8 =
           __gnu_cxx::
           __normal_iterator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_*,_std::vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>_>
           ::operator++(in_stack_fffffffffffffed8,(int)((ulong)in_stack_fffffffffffffed0 >> 0x20));
    }
    std::
    vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
    ::operator[](&local_18->neighbors,0);
    std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>::
    reserve(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    in_RDI[0x16].first = in_RDI[0x16].first + 1;
    if (in_RDI[0x16].first == 1) {
      in_RDI[5].second = (float)local_18->layer;
      in_RDI[5].first = local_c;
    }
    else {
      pVVar4 = (Vertex *)
               Matrix::operator[](in_stack_fffffffffffffed0,(size_t)in_stack_fffffffffffffec8);
      __x = in_RDI + 5;
      PVar8 = in_RDI[0x17];
      this_04 = pVVar4;
      pfVar5 = Matrix::operator[](in_stack_fffffffffffffed0,(size_t)in_stack_fffffffffffffec8);
      local_4c = (float)(*(code *)**(undefined8 **)PVar8)(PVar8,pVVar4,pfVar5);
      std::pair<unsigned_int,_float>::pair<unsigned_int_&,_float,_true>
                (&local_48,&__x->first,&local_4c);
      for (local_50 = in_RDI[5].second; local_18->layer < (int)local_50;
          local_50 = (float)((int)local_50 + -1)) {
        SearchUpperLayer(in_stack_ffffffffffffff20,
                         (float *)CONCAT17(cVar9,in_stack_ffffffffffffff18),in_RDI,
                         (layer_t)((ulong)__x >> 0x20));
      }
      piVar6 = std::min<int>(&local_18->layer,(int *)&in_RDI[5].second);
      for (local_54 = *piVar6; -1 < local_54; local_54 = local_54 + -1) {
        if (local_54 == 0) {
          local_58 = (float)in_RDI[2].first;
        }
        else {
          local_58 = in_RDI[1].second;
        }
        this_03 = &local_78;
        SearchLayer((HNSWIndex *)this_00._M_current,(float *)q_00._M_current,
                    (Point *)in_stack_ffffffffffffffc8._M_current,(uint32_t)((ulong)this_04 >> 0x20)
                    ,(uint32_t)this_04);
        pVVar4 = this_04;
        MaxHeap::Container(this_03);
        SelectNeighborsHeuristic
                  ((HNSWIndex *)this_00._M_current,(float *)q_00._M_current,
                   in_stack_ffffffffffffffc8._M_current,(uint32_t)((ulong)pVVar4 >> 0x20));
        local_a8 = local_90;
        local_b0._M_current =
             (pair<unsigned_int,_float> *)
             std::
             vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
             ::begin(in_stack_fffffffffffffec8);
        std::
        vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>::
        end(in_stack_fffffffffffffec8);
        while (bVar1 = __gnu_cxx::operator!=
                                 ((__normal_iterator<std::pair<unsigned_int,_float>_*,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
                                   *)in_stack_fffffffffffffed0,
                                  (__normal_iterator<std::pair<unsigned_int,_float>_*,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
                                   *)in_stack_fffffffffffffec8), bVar1) {
          ppVar7 = __gnu_cxx::
                   __normal_iterator<std::pair<unsigned_int,_float>_*,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
                   ::operator*(&local_b0);
          std::vector<hnsw::HNSWIndex::Vertex,_std::allocator<hnsw::HNSWIndex::Vertex>_>::operator[]
                    ((vector<hnsw::HNSWIndex::Vertex,_std::allocator<hnsw::HNSWIndex::Vertex>_> *)
                     (in_RDI + 6),(ulong)ppVar7->first);
          Vertex::ConnectTo(this_04,(index_t)((ulong)this_03 >> 0x20),SUB84(this_03,0),
                            (layer_t)((ulong)in_stack_fffffffffffffed0 >> 0x20));
          Vertex::ConnectTo(this_04,(index_t)((ulong)this_03 >> 0x20),SUB84(this_03,0),
                            (layer_t)((ulong)in_stack_fffffffffffffed0 >> 0x20));
          this_01 = std::vector<hnsw::HNSWIndex::Vertex,_std::allocator<hnsw::HNSWIndex::Vertex>_>::
                    operator[]((vector<hnsw::HNSWIndex::Vertex,_std::allocator<hnsw::HNSWIndex::Vertex>_>
                                *)(in_RDI + 6),(ulong)ppVar7->first);
          this_02 = std::
                    vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                    ::operator[](&this_01->neighbors,(long)local_54);
          sVar3 = std::
                  vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                  ::size(this_02);
          if ((uint)local_58 < sVar3) {
            in_stack_fffffffffffffed0 =
                 (Matrix *)
                 Matrix::operator[](in_stack_fffffffffffffed0,(size_t)in_stack_fffffffffffffec8);
            SelectNeighborsHeuristic
                      ((HNSWIndex *)this_00._M_current,(float *)q_00._M_current,
                       in_stack_ffffffffffffffc8._M_current,(uint32_t)((ulong)pVVar4 >> 0x20));
            std::
            vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
            ::operator=((vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                         *)this_04,
                        (vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                         *)this_03);
            std::
            vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
            ::~vector((vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                       *)this_04);
          }
          __gnu_cxx::
          __normal_iterator<std::pair<unsigned_int,_float>_*,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
          ::operator++(&local_b0);
        }
        std::
        vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>::
        ~vector((vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                 *)this_04);
        MaxHeap::~MaxHeap((MaxHeap *)0x11832e);
        this_04 = pVVar4;
      }
      if ((int)in_RDI[5].second < local_18->layer) {
        in_RDI[5].second = (float)local_18->layer;
        in_RDI[5].first = local_c;
      }
    }
    return;
  }
  __assert_fail("vertex.layer == 0 && vertex.neighbors.size() == 0 && \"Vertex has already been inserted\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/KinglittleQ[P]hnsw/include/hnsw.hpp"
                ,0x5a,"void hnsw::HNSWIndex::Insert(index_t)");
}

Assistant:

void Insert(index_t q) {
    Vertex &vertex = vertices_[q];
    assert(vertex.layer == 0 && vertex.neighbors.size() == 0 && "Vertex has already been inserted");
    vertex.layer = RandomChoiceLayer();
    vertex.neighbors.resize(vertex.layer + 1);
    for (auto iter = vertex.neighbors.begin() + 1; iter != vertex.neighbors.end(); iter++) {
      iter->reserve(maxM_);
    }
    vertex.neighbors[0].reserve(maxM0_);

    num_points_ += 1;

    if (num_points_ == 1) {
      top_layer_ = vertex.layer;
      ep_ = q;
      return;
    }

    const float *query = points_[q];
    Point ep(ep_, distance_(query, points_[ep_]));
    for (layer_t l = top_layer_; l > vertex.layer; l--) {
      SearchUpperLayer(query, ep, l);
    }

    // Search neighbors and connect to them
    for (layer_t l = std::min(vertex.layer, top_layer_); l >= 0; l--) {
      uint32_t maxM = (l == 0) ? maxM0_ : maxM_;
      MaxHeap candidates = SearchLayer(query, ep, ef_construction_, l);
      PointSet selected_points =
          SelectNeighborsHeuristic(query, candidates.Container(), M_);  // next ep

      for (const Point &p : selected_points) {
        vertices_[p.first].ConnectTo(q, p.second, l);
        vertex.ConnectTo(p.first, p.second, l);

        // Shrink neighbors
        auto &edges = vertices_[p.first].neighbors[l];
        if (edges.size() > maxM) {
          edges = SelectNeighborsHeuristic(points_[p.first], edges, maxM);
        }
      }
    }

    if (vertex.layer > top_layer_) {
      top_layer_ = vertex.layer;
      ep_ = q;
    }

    return;
  }